

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::BuildResultEx(Clipper *this,ExPolygons *polys)

{
  pointer ppOVar1;
  OutPt *pOVar2;
  ulong uVar3;
  Polygon pg;
  ExPolygon epg;
  int local_94;
  _Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_88;
  ExPolygon local_68;
  
  uVar3 = 0;
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize(polys,0);
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::reserve
            (polys,(long)(this->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_PolyOuts).
                         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_94 = 0;
  while ((ppOVar1 = (this->m_PolyOuts).
                    super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
         uVar3 < (ulong)((long)(this->m_PolyOuts).
                               super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3) &&
         (ppOVar1[uVar3]->pts != (OutPt *)0x0))) {
    local_68.holes.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.holes.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.holes.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pOVar2 = ppOVar1[uVar3]->pts;
    do {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                (&local_68.outer,&pOVar2->pt);
      pOVar2 = pOVar2->next;
      ppOVar1 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (pOVar2 != ppOVar1[uVar3]->pts);
    uVar3 = uVar3 + 1;
    if (0x20 < (ulong)((long)local_68.outer.
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68.outer.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      while (((uVar3 < (ulong)((long)(this->m_PolyOuts).
                                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3
                              ) && (ppOVar1[uVar3]->pts != (OutPt *)0x0)) &&
             (ppOVar1[uVar3]->isHole == true))) {
        local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pOVar2 = ppOVar1[uVar3]->pts;
        do {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                    ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                     &local_88,&pOVar2->pt);
          pOVar2 = pOVar2->next;
        } while (pOVar2 != (this->m_PolyOuts).
                           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar3]->pts);
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(&local_68.holes,(value_type *)&local_88);
        uVar3 = uVar3 + 1;
        std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        ~_Vector_base(&local_88);
        ppOVar1 = (this->m_PolyOuts).
                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::push_back
                (polys,&local_68);
      local_94 = local_94 + 1;
    }
    ExPolygon::~ExPolygon(&local_68);
  }
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize
            (polys,(long)local_94);
  return;
}

Assistant:

void Clipper::BuildResultEx(ExPolygons &polys)
{
  PolyOutList::size_type i = 0;
  int k = 0;
  polys.resize(0);
  polys.reserve(m_PolyOuts.size());
  while (i < m_PolyOuts.size() && m_PolyOuts[i]->pts)
  {
    ExPolygon epg;
    OutPt* p = m_PolyOuts[i]->pts;
    do {
      epg.outer.push_back(p->pt);
      p = p->next;
    } while (p != m_PolyOuts[i]->pts);
    i++;
    //make sure polygons have at least 3 vertices ...
    if (epg.outer.size() < 3) continue;
    while (i < m_PolyOuts.size()
      && m_PolyOuts[i]->pts && m_PolyOuts[i]->isHole)
    {
      Polygon pg;
      p = m_PolyOuts[i]->pts;
      do {
        pg.push_back(p->pt);
        p = p->next;
      } while (p != m_PolyOuts[i]->pts);
      epg.holes.push_back(pg);
      i++;
    }
    polys.push_back(epg);
    k++;
  }
  polys.resize(k);
}